

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tjunittest.c
# Opt level: O0

void overflowTest(void)

{
  unsigned_long uVar1;
  unsigned_long size;
  int in_stack_0000000c;
  int in_stack_00000010;
  int in_stack_00000014;
  int in_stack_00000018;
  int in_stack_0000001c;
  
  uVar1 = tjBufSize(in_stack_00000014,in_stack_00000010,in_stack_0000000c);
  if (uVar1 < 0xffffffff) {
    printf("ERROR: %s\n","tjBufSize() overflow");
    exitStatus = -1;
  }
  else {
    uVar1 = TJBUFSIZE(size._4_4_,(int)size);
    if (uVar1 < 0xffffffff) {
      printf("ERROR: %s\n","TJBUFSIZE() overflow");
      exitStatus = -1;
    }
    else {
      uVar1 = tjBufSizeYUV2(in_stack_0000001c,in_stack_00000018,in_stack_00000014,in_stack_00000010)
      ;
      if (uVar1 < 0xffffffff) {
        printf("ERROR: %s\n","tjBufSizeYUV2() overflow");
        exitStatus = -1;
      }
      else {
        uVar1 = TJBUFSIZEYUV(size._4_4_,(int)size,(int)(uVar1 >> 0x20));
        if (uVar1 < 0xffffffff) {
          printf("ERROR: %s\n","TJBUFSIZEYUV() overflow");
          exitStatus = -1;
        }
        else {
          uVar1 = tjBufSizeYUV(size._4_4_,(int)size,(int)(uVar1 >> 0x20));
          if (uVar1 < 0xffffffff) {
            printf("ERROR: %s\n","tjBufSizeYUV() overflow");
            exitStatus = -1;
          }
          else {
            uVar1 = tjPlaneSizeYUV(in_stack_0000001c,in_stack_00000018,in_stack_00000014,
                                   in_stack_00000010,in_stack_0000000c);
            if (uVar1 < 0xffffffff) {
              printf("ERROR: %s\n","tjPlaneSizeYUV() overflow");
              exitStatus = -1;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void overflowTest(void)
{
  /* Ensure that the various buffer size functions don't overflow */
  unsigned long size;

  size = tjBufSize(26755, 26755, TJSAMP_444);
  CHECKSIZE(tjBufSize());
  size = TJBUFSIZE(26755, 26755);
  CHECKSIZE(TJBUFSIZE());
  size = tjBufSizeYUV2(37838, 1, 37838, TJSAMP_444);
  CHECKSIZE(tjBufSizeYUV2());
  size = TJBUFSIZEYUV(37838, 37838, TJSAMP_444);
  CHECKSIZE(TJBUFSIZEYUV());
  size = tjBufSizeYUV(37838, 37838, TJSAMP_444);
  CHECKSIZE(tjBufSizeYUV());
  size = tjPlaneSizeYUV(0, 65536, 0, 65536, TJSAMP_444);
  CHECKSIZE(tjPlaneSizeYUV());

bailout:
  return;
}